

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall wasm::Asyncify::addGlobals(Asyncify *this,Module *module,bool imported)

{
  Type TVar1;
  pointer puVar2;
  pointer puVar3;
  char *pcVar4;
  Type type;
  uintptr_t uVar5;
  Const *pCVar6;
  undefined7 in_register_00000011;
  Name name;
  Name name_00;
  Builder local_48;
  Builder builder;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> asyncifyState;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> asyncifyData;
  
  TVar1.id = DAT_011756f8.id;
  puVar2 = wasm::(anonymous_namespace)::ASYNCIFY_STATE;
  local_48.wasm = module;
  pCVar6 = Builder::makeConst<int>(&local_48,0);
  name.super_IString.str._M_str = (char *)puVar2;
  name.super_IString.str._M_len = (size_t)&builder;
  Builder::makeGlobal(name,TVar1,(Expression *)0x2,(Mutability)pCVar6);
  puVar2 = DAT_01174c48;
  if ((int)CONCAT71(in_register_00000011,imported) != 0) {
    ((builder.wasm)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ENV;
    ((builder.wasm)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar2;
    puVar3 = (pointer)DAT_011756f8.id;
    ((builder.wasm)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = wasm::(anonymous_namespace)::ASYNCIFY_STATE
    ;
    ((builder.wasm)->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar3;
  }
  Module::addGlobal(module,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&builder)
  ;
  type.id = DAT_01175718.id;
  pcVar4 = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
  TVar1.id = (this->pointerType).id;
  pCVar6 = Builder::makeConst<wasm::Type>(&local_48,TVar1);
  name_00.super_IString.str._M_str = pcVar4;
  name_00.super_IString.str._M_len = (size_t)&asyncifyState;
  Builder::makeGlobal(name_00,type,(Expression *)TVar1.id,(Mutability)pCVar6);
  puVar2 = DAT_01174c48;
  if (imported) {
    *(pointer *)
     ((long)asyncifyState._M_t.
            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x18) = ENV;
    *(pointer *)
     ((long)asyncifyState._M_t.
            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20) = puVar2;
    uVar5 = DAT_01175718.id;
    *(char **)((long)asyncifyState._M_t.
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x28) =
         wasm::(anonymous_namespace)::ASYNCIFY_DATA;
    *(uintptr_t *)
     ((long)asyncifyState._M_t.
            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x30) = uVar5;
  }
  Module::addGlobal(module,&asyncifyState);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&asyncifyState);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
            ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&builder);
  return;
}

Assistant:

void addGlobals(Module* module, bool imported) {
    Builder builder(*module);

    auto asyncifyState = builder.makeGlobal(ASYNCIFY_STATE,
                                            Type::i32,
                                            builder.makeConst(int32_t(0)),
                                            Builder::Mutable);
    if (imported) {
      asyncifyState->module = ENV;
      asyncifyState->base = ASYNCIFY_STATE;
    }
    module->addGlobal(std::move(asyncifyState));

    auto asyncifyData = builder.makeGlobal(ASYNCIFY_DATA,
                                           pointerType,
                                           builder.makeConst(pointerType),
                                           Builder::Mutable);
    if (imported) {
      asyncifyData->module = ENV;
      asyncifyData->base = ASYNCIFY_DATA;
    }
    module->addGlobal(std::move(asyncifyData));
  }